

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack32_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  *out = *in + base;
  out[1] = in[1] + base;
  out[2] = in[2] + base;
  out[3] = in[3] + base;
  out[4] = in[4] + base;
  out[5] = in[5] + base;
  out[6] = in[6] + base;
  out[7] = in[7] + base;
  out[8] = in[8] + base;
  out[9] = in[9] + base;
  out[10] = in[10] + base;
  out[0xb] = in[0xb] + base;
  out[0xc] = in[0xc] + base;
  out[0xd] = in[0xd] + base;
  out[0xe] = in[0xe] + base;
  out[0xf] = base + in[0xf];
  return in + 0x10;
}

Assistant:

uint32_t * unpack32_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}